

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

Float __thiscall pbrt::Vertex::ConvertDensity(Vertex *this,Float pdf,Vertex *next)

{
  undefined8 uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  uint *puVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  
  if ((next->type != Light) ||
     ((puVar9 = (uint *)((ulong)(next->field_2).ei.field_0 & 0xffffffffffff), fVar11 = pdf,
      puVar9 != (uint *)0x0 && ((*puVar9 & 0xfffffffd) != 1)))) {
    fVar7 = ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
            (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5 -
            ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
            (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    uVar1 = *(undefined8 *)
             &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])((long)&next->field_2 + 8),
                            ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                          super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10);
    auVar14._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
    auVar14._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
    auVar14._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
    auVar14._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
    uVar1 = *(undefined8 *)
             &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])((long)&this->field_2 + 8),
                            ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                          super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10);
    auVar12._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
    auVar12._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
    auVar12._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
    auVar12._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
    auVar10 = vsubps_avx(auVar14,auVar12);
    fVar3 = auVar10._0_4_;
    auVar15._0_4_ = fVar3 * fVar3;
    fVar4 = auVar10._4_4_;
    auVar15._4_4_ = fVar4 * fVar4;
    fVar5 = auVar10._8_4_;
    auVar15._8_4_ = fVar5 * fVar5;
    fVar6 = auVar10._12_4_;
    auVar15._12_4_ = fVar6 * fVar6;
    auVar10 = vmovshdup_avx(auVar15);
    fVar18 = fVar7 * fVar7 + auVar15._0_4_ + auVar10._0_4_;
    if ((fVar18 != 0.0) || (fVar11 = 0.0, NAN(fVar18))) {
      fVar18 = 1.0 / fVar18;
      if (((((next->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
           (fVar11 = (next->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y,
           fVar11 != 0.0)) || (NAN(fVar11))) ||
         ((fVar11 = (next->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
          fVar11 != 0.0 || (NAN(fVar11))))) {
        if (fVar18 < 0.0) {
          fVar11 = sqrtf(fVar18);
        }
        else {
          auVar10 = vsqrtss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
          fVar11 = auVar10._0_4_;
        }
        auVar13._0_4_ = fVar3 * fVar11;
        auVar13._4_4_ = fVar4 * fVar11;
        auVar13._8_4_ = fVar5 * fVar11;
        auVar13._12_4_ = fVar6 * fVar11;
        uVar2._0_4_ = (((Interaction *)&next->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y;
        uVar2._4_4_ = (((Interaction *)&next->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar2;
        auVar17._0_4_ = auVar13._0_4_ * (float)(undefined4)uVar2;
        auVar17._4_4_ = auVar13._4_4_ * (float)uVar2._4_4_;
        auVar17._8_4_ = auVar13._8_4_ * 0.0;
        auVar17._12_4_ = auVar13._12_4_ * 0.0;
        auVar10._8_4_ = 0x80000000;
        auVar10._0_8_ = 0x8000000080000000;
        auVar10._12_4_ = 0x80000000;
        auVar10 = vxorps_avx512vl(auVar17,auVar10);
        auVar10 = vpermi2ps_avx512vl(_DAT_00568d00,auVar17,auVar10);
        auVar10 = vfmadd231ps_fma(auVar10,auVar16,auVar13);
        auVar10 = vhaddps_avx(auVar10,auVar10);
        auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(fVar7 * fVar11)),
                                  ZEXT416((uint)(next->field_2).ei.super_Interaction.n.
                                                super_Tuple3<pbrt::Normal3,_float>.x));
        auVar8._8_4_ = 0x7fffffff;
        auVar8._0_8_ = 0x7fffffff7fffffff;
        auVar8._12_4_ = 0x7fffffff;
        auVar10 = vandps_avx512vl(auVar10,auVar8);
        pdf = auVar10._0_4_ * pdf;
      }
      fVar11 = fVar18 * pdf;
    }
  }
  return fVar11;
}

Assistant:

Float ConvertDensity(Float pdf, const Vertex &next) const {
        // Return solid angle density if _next_ is an infinite area light
        if (next.IsInfiniteLight())
            return pdf;

        Vector3f w = next.p() - p();
        if (LengthSquared(w) == 0)
            return 0;
        Float invDist2 = 1 / LengthSquared(w);
        if (next.IsOnSurface())
            pdf *= AbsDot(next.ng(), w * std::sqrt(invDist2));
        return pdf * invDist2;
    }